

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

BOOL __thiscall
Js::FunctionBody::GetMatchingStatementMap
          (FunctionBody *this,StatementData *data,int statementIndex,FunctionBody *inlinee)

{
  SmallSpanSequence *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  undefined4 *puVar4;
  Type *pTVar5;
  SmallSpanSequenceIter local_38;
  
  if (-1 < statementIndex) {
    if (inlinee == (FunctionBody *)0x0) {
      inlinee = this;
    }
    this_00 = (inlinee->m_sourceInfo).pSpanSequence;
    if (this_00 == (SmallSpanSequence *)0x0) {
      this_01 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
      if (this_01 ==
          (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xd6d,"(pStatementMaps)","pStatementMaps");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      if ((this_01->
          super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
          count <= statementIndex) {
        return 0;
      }
      pTVar5 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,statementIndex);
      data->sourceBegin = (pTVar5->ptr->sourceSpan).begin;
      pTVar5 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,statementIndex);
      data->bytecodeBegin = (pTVar5->ptr->byteCodeSpan).begin;
      return 1;
    }
    local_38.accumulatedIndex = 0;
    local_38.accumulatedSourceBegin = this_00->baseValue;
    local_38.accumulatedBytecodeBegin = 0;
    local_38.indexOfActualOffset = 0;
    BVar3 = SmallSpanSequence::Item(this_00,statementIndex,&local_38,data);
    if (BVar3 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL FunctionBody::GetMatchingStatementMap(StatementData &data, int statementIndex, FunctionBody *inlinee)
    {
        SourceInfo *si = &this->m_sourceInfo;
        if (inlinee)
        {
            si = &inlinee->m_sourceInfo;
            Assert(si);
        }

        if (statementIndex >= 0)
        {
            SmallSpanSequence *pSpanSequence = si->pSpanSequence;
            if (pSpanSequence)
            {
                SmallSpanSequenceIter iter;
                pSpanSequence->Reset(iter);

                if (pSpanSequence->Item(statementIndex, iter, data))
                {
                    return TRUE;
                }
            }
            else
            {
                StatementMapList* pStatementMaps = GetStatementMaps();
                Assert(pStatementMaps);
                if (statementIndex >= pStatementMaps->Count())
                {
                    return FALSE;
                }

                data.sourceBegin = pStatementMaps->Item(statementIndex)->sourceSpan.begin;
                data.bytecodeBegin = pStatementMaps->Item(statementIndex)->byteCodeSpan.begin;
                return TRUE;
            }
        }

        return FALSE;
    }